

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

int mdns_string_skip(void *buffer,size_t size,size_t *offset)

{
  size_t sVar1;
  mdns_string_pair_t local_40;
  
  sVar1 = *offset;
  while( true ) {
    mdns_get_next_substring(&local_40,buffer,size,sVar1);
    if (local_40.offset == 0xffffffffffffffff) {
      return 0;
    }
    if (local_40.ref != 0) break;
    sVar1 = local_40.offset + local_40.length;
    if (local_40.length == 0) {
      sVar1 = sVar1 + 1;
LAB_002425c8:
      *offset = sVar1;
      return 1;
    }
  }
  sVar1 = sVar1 + 2;
  goto LAB_002425c8;
}

Assistant:

int
mdns_string_skip(const void* buffer, size_t size, size_t* offset) {
	size_t cur = *offset;
	mdns_string_pair_t substr;
	do {
		substr = mdns_get_next_substring(buffer, size, cur);
		if (substr.offset == MDNS_INVALID_POS)
			return 0;
		if (substr.ref) {
			*offset = cur + 2;
			return 1;
		}
		cur = substr.offset + substr.length;
	}
	while (substr.length);

	*offset = cur + 1;
	return 1;
}